

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

uint64_t __thiscall kratos::XXHash64::hash(XXHash64 *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uchar *puVar9;
  ulong uVar10;
  uchar *stop;
  uchar *data;
  uint64_t result;
  XXHash64 *this_local;
  
  if (this->totalLength < 0x20) {
    data = (uchar *)(this->state[2] + 0x27d4eb2f165667c5);
  }
  else {
    uVar1 = rotateLeft(this->state[0],'\x01');
    uVar2 = rotateLeft(this->state[1],'\a');
    uVar3 = rotateLeft(this->state[2],'\f');
    uVar4 = rotateLeft(this->state[3],'\x12');
    uVar5 = processSingle(0,this->state[0]);
    uVar6 = processSingle(0,this->state[1]);
    uVar7 = processSingle(0,this->state[2]);
    uVar8 = processSingle(0,this->state[3]);
    data = (uchar *)(((((uVar1 + uVar2 + uVar3 + uVar4 ^ uVar5) * -0x61c8864e7a143579 +
                        0x85ebca77c2b2ae63 ^ uVar6) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63 ^
                      uVar7) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63 ^ uVar8) *
                     -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  }
  data = data + this->totalLength;
  stop = this->buffer;
  puVar9 = stop + this->bufferSize;
  for (; stop + 8 <= puVar9; stop = stop + 8) {
    uVar1 = processSingle(0,*(uint64_t *)stop);
    uVar1 = rotateLeft((ulong)data ^ uVar1,'\x1b');
    data = (uchar *)(uVar1 * -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  }
  if (stop + 4 <= puVar9) {
    uVar1 = rotateLeft((ulong)data ^ (ulong)*(uint *)stop * -0x61c8864e7a143579,'\x17');
    data = (uchar *)(uVar1 * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9);
    stop = stop + 4;
  }
  while (stop != puVar9) {
    uVar1 = rotateLeft((ulong)data ^ (ulong)*stop * 0x27d4eb2f165667c5,'\v');
    data = (uchar *)(uVar1 * -0x61c8864e7a143579);
    stop = stop + 1;
  }
  uVar10 = ((ulong)data >> 0x21 ^ (ulong)data) * -0x3d4d51c2d82b14b1;
  uVar10 = (uVar10 >> 0x1d ^ uVar10) * 0x165667b19e3779f9;
  return uVar10 >> 0x20 ^ uVar10;
}

Assistant:

[[nodiscard]] uint64_t hash() const {
        // fold 256 bit state into one single 64 bit value
        uint64_t result;
        if (totalLength >= MaxBufferSize) {
            result = rotateLeft(state[0], 1) + rotateLeft(state[1], 7) + rotateLeft(state[2], 12) +
                     rotateLeft(state[3], 18);
            result = (result ^ processSingle(0, state[0])) * Prime1 + Prime4;
            result = (result ^ processSingle(0, state[1])) * Prime1 + Prime4;
            result = (result ^ processSingle(0, state[2])) * Prime1 + Prime4;
            result = (result ^ processSingle(0, state[3])) * Prime1 + Prime4;
        } else {
            // internal state wasn't set in add(), therefore original seed is still stored in state2
            result = state[2] + Prime5;
        }

        result += totalLength;

        // process remaining bytes in temporary buffer
        const unsigned char* data = buffer;
        // point beyond last byte
        const unsigned char* stop = data + bufferSize;

        // at least 8 bytes left ? => eat 8 bytes per step
        for (; data + 8 <= stop; data += 8)
            result = rotateLeft(result ^ processSingle(0, *(uint64_t*)data), 27) * Prime1 + Prime4;

        // 4 bytes left ? => eat those
        if (data + 4 <= stop) {
            result = rotateLeft(result ^ (*(uint32_t*)data) * Prime1, 23) * Prime2 + Prime3;
            data += 4;
        }

        // take care of remaining 0..3 bytes, eat 1 byte per step
        while (data != stop) result = rotateLeft(result ^ (*data++) * Prime5, 11) * Prime1;

        // mix bits
        result ^= result >> 33u;
        result *= Prime2;
        result ^= result >> 29u;
        result *= Prime3;
        result ^= result >> 32u;
        return result;
    }